

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_get_response_code_text(mg_connection *conn,int response_code)

{
  int response_code_local;
  mg_connection *conn_local;
  
  if (response_code - 100U < 0x19b || response_code == 0x1ff) {
    switch((long)&switchD_00120d88::switchdataD_001d0630 +
           (long)(int)(&switchD_00120d88::switchdataD_001d0630)[response_code - 100U]) {
    case 0x120d8a:
      conn_local = (mg_connection *)anon_var_dwarf_1d22d;
      break;
    case 0x120d9a:
      conn_local = (mg_connection *)anon_var_dwarf_1d238;
      break;
    case 0x120daa:
      conn_local = (mg_connection *)anon_var_dwarf_1d24f;
      break;
    case 0x120dba:
      conn_local = (mg_connection *)anon_var_dwarf_1d25a;
      break;
    case 0x120dca:
      conn_local = (mg_connection *)anon_var_dwarf_1d265;
      break;
    case 0x120dda:
      conn_local = (mg_connection *)anon_var_dwarf_1d27c;
      break;
    case 0x120dea:
      conn_local = (mg_connection *)anon_var_dwarf_1d287;
      break;
    case 0x120dfa:
      conn_local = (mg_connection *)anon_var_dwarf_1d29e;
      break;
    case 0x120e0a:
      conn_local = (mg_connection *)anon_var_dwarf_1d2a9;
      break;
    case 0x120e1a:
      conn_local = (mg_connection *)anon_var_dwarf_1d2c0;
      break;
    case 0x120e2a:
      conn_local = (mg_connection *)anon_var_dwarf_1d2d7;
      break;
    case 0x120e3a:
      conn_local = (mg_connection *)anon_var_dwarf_1d2ee;
      break;
    case 0x120e4a:
      conn_local = (mg_connection *)anon_var_dwarf_1d2f9;
      break;
    case 0x120e5a:
      conn_local = (mg_connection *)anon_var_dwarf_1d304;
      break;
    case 0x120e6a:
      conn_local = (mg_connection *)anon_var_dwarf_1d30f;
      break;
    case 0x120e7a:
      conn_local = (mg_connection *)0x1d1924;
      break;
    case 0x120e8a:
      conn_local = (mg_connection *)anon_var_dwarf_1d33d;
      break;
    case 0x120e9a:
      conn_local = (mg_connection *)anon_var_dwarf_1d354;
      break;
    case 0x120eaa:
      conn_local = (mg_connection *)anon_var_dwarf_1d35f;
      break;
    case 0x120eba:
      conn_local = (mg_connection *)anon_var_dwarf_1d36a;
      break;
    case 0x120eca:
      conn_local = (mg_connection *)anon_var_dwarf_1d381;
      break;
    case 0x120eda:
      conn_local = (mg_connection *)anon_var_dwarf_1d38c;
      break;
    case 0x120eea:
      conn_local = (mg_connection *)anon_var_dwarf_1d3a3;
      break;
    case 0x120efa:
      conn_local = (mg_connection *)anon_var_dwarf_1d3ae;
      break;
    case 0x120f0a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3b9;
      break;
    case 0x120f1a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3c4;
      break;
    case 0x120f2a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3cf;
      break;
    case 0x120f3a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3da;
      break;
    case 0x120f4a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3f1;
      break;
    case 0x120f5a:
      conn_local = (mg_connection *)anon_var_dwarf_1d3fc;
      break;
    case 0x120f6a:
      conn_local = (mg_connection *)anon_var_dwarf_1d407;
      break;
    case 0x120f7a:
      conn_local = (mg_connection *)anon_var_dwarf_1d412;
      break;
    case 0x120f8a:
      conn_local = (mg_connection *)anon_var_dwarf_1d41d;
      break;
    case 0x120f9a:
      conn_local = (mg_connection *)anon_var_dwarf_1d428;
      break;
    case 0x120faa:
      conn_local = (mg_connection *)anon_var_dwarf_1d433;
      break;
    case 0x120fba:
      conn_local = (mg_connection *)anon_var_dwarf_1d44a;
      break;
    case 0x120fca:
      conn_local = (mg_connection *)anon_var_dwarf_1d461;
      break;
    case 0x120fda:
      conn_local = (mg_connection *)anon_var_dwarf_1d478;
      break;
    case 0x120fea:
      conn_local = (mg_connection *)anon_var_dwarf_1d48f;
      break;
    case 0x120ffa:
      conn_local = (mg_connection *)anon_var_dwarf_1d49a;
      break;
    case 0x12100a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4a5;
      break;
    case 0x12101a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4b0;
      break;
    case 0x12102a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4c7;
      break;
    case 0x12103a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4d2;
      break;
    case 0x12104a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4dd;
      break;
    case 0x12105a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4e8;
      break;
    case 0x12106a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4f3;
      break;
    case 0x12107a:
      conn_local = (mg_connection *)anon_var_dwarf_1d4fe;
      break;
    case 0x12108a:
      conn_local = (mg_connection *)anon_var_dwarf_1d509;
      break;
    case 0x12109a:
      conn_local = (mg_connection *)anon_var_dwarf_1d514;
      break;
    case 0x1210aa:
      conn_local = (mg_connection *)anon_var_dwarf_1d51f;
      break;
    case 0x1210ba:
      conn_local = (mg_connection *)anon_var_dwarf_1d52a;
      break;
    case 0x1210ca:
      conn_local = (mg_connection *)anon_var_dwarf_1d535;
      break;
    case 0x1210da:
      conn_local = (mg_connection *)anon_var_dwarf_1d540;
      break;
    case 0x1210ea:
      conn_local = (mg_connection *)anon_var_dwarf_1d557;
      break;
    case 0x1210fa:
      conn_local = (mg_connection *)anon_var_dwarf_1d56e;
      break;
    case 0x12110a:
      conn_local = (mg_connection *)anon_var_dwarf_1d585;
      break;
    case 0x12111a:
      conn_local = (mg_connection *)anon_var_dwarf_1d590;
      break;
    case 0x12112a:
      conn_local = (mg_connection *)anon_var_dwarf_1d59b;
      break;
    case 0x12113a:
      conn_local = (mg_connection *)anon_var_dwarf_1d5a6;
      break;
    case 0x12114a:
      conn_local = (mg_connection *)anon_var_dwarf_1d5b1;
      break;
    case 0x12115a:
      conn_local = (mg_connection *)anon_var_dwarf_1d5bc;
      break;
    case 0x12116a:
      conn_local = (mg_connection *)anon_var_dwarf_1d5c7;
      break;
    case 0x12117a:
      conn_local = (mg_connection *)anon_var_dwarf_1d5d2;
      break;
    default:
      goto switchD_00120d88_caseD_12118a;
    }
  }
  else {
switchD_00120d88_caseD_12118a:
    if (conn != (mg_connection *)0x0) {
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,"mg_get_response_code_text",0x10f7,
                 "Unknown HTTP response code: %u",(ulong)(uint)response_code);
    }
    if ((response_code < 100) || (199 < response_code)) {
      if ((response_code < 200) || (299 < response_code)) {
        if ((response_code < 300) || (399 < response_code)) {
          if ((response_code < 400) || (499 < response_code)) {
            if ((response_code < 500) || (599 < response_code)) {
              conn_local = (mg_connection *)0x1d1ec3;
            }
            else {
              conn_local = (mg_connection *)0x1d1ae9;
            }
          }
          else {
            conn_local = (mg_connection *)anon_var_dwarf_1d631;
          }
        }
        else {
          conn_local = (mg_connection *)anon_var_dwarf_1d626;
        }
      }
      else {
        conn_local = (mg_connection *)anon_var_dwarf_1d61b;
      }
    }
    else {
      conn_local = (mg_connection *)0x1d1827;
    }
  }
  return (char *)conn_local;
}

Assistant:

CIVETWEB_API const char *
mg_get_response_code_text(const struct mg_connection *conn, int response_code)
{
	/* See IANA HTTP status code assignment:
	 * http://www.iana.org/assignments/http-status-codes/http-status-codes.xhtml
	 */

	switch (response_code) {
		/* RFC2616 Section 10.1 - Informational 1xx */
	case 100:
		return "Continue"; /* RFC2616 Section 10.1.1 */
	case 101:
		return "Switching Protocols"; /* RFC2616 Section 10.1.2 */
	case 102:
		return "Processing"; /* RFC2518 Section 10.1 */

		/* RFC2616 Section 10.2 - Successful 2xx */
	case 200:
		return "OK"; /* RFC2616 Section 10.2.1 */
	case 201:
		return "Created"; /* RFC2616 Section 10.2.2 */
	case 202:
		return "Accepted"; /* RFC2616 Section 10.2.3 */
	case 203:
		return "Non-Authoritative Information"; /* RFC2616 Section 10.2.4 */
	case 204:
		return "No Content"; /* RFC2616 Section 10.2.5 */
	case 205:
		return "Reset Content"; /* RFC2616 Section 10.2.6 */
	case 206:
		return "Partial Content"; /* RFC2616 Section 10.2.7 */
	case 207:
		return "Multi-Status"; /* RFC2518 Section 10.2, RFC4918 Section 11.1
		                        */
	case 208:
		return "Already Reported"; /* RFC5842 Section 7.1 */

	case 226:
		return "IM used"; /* RFC3229 Section 10.4.1 */

		/* RFC2616 Section 10.3 - Redirection 3xx */
	case 300:
		return "Multiple Choices"; /* RFC2616 Section 10.3.1 */
	case 301:
		return "Moved Permanently"; /* RFC2616 Section 10.3.2 */
	case 302:
		return "Found"; /* RFC2616 Section 10.3.3 */
	case 303:
		return "See Other"; /* RFC2616 Section 10.3.4 */
	case 304:
		return "Not Modified"; /* RFC2616 Section 10.3.5 */
	case 305:
		return "Use Proxy"; /* RFC2616 Section 10.3.6 */
	case 307:
		return "Temporary Redirect"; /* RFC2616 Section 10.3.8 */
	case 308:
		return "Permanent Redirect"; /* RFC7238 Section 3 */

		/* RFC2616 Section 10.4 - Client Error 4xx */
	case 400:
		return "Bad Request"; /* RFC2616 Section 10.4.1 */
	case 401:
		return "Unauthorized"; /* RFC2616 Section 10.4.2 */
	case 402:
		return "Payment Required"; /* RFC2616 Section 10.4.3 */
	case 403:
		return "Forbidden"; /* RFC2616 Section 10.4.4 */
	case 404:
		return "Not Found"; /* RFC2616 Section 10.4.5 */
	case 405:
		return "Method Not Allowed"; /* RFC2616 Section 10.4.6 */
	case 406:
		return "Not Acceptable"; /* RFC2616 Section 10.4.7 */
	case 407:
		return "Proxy Authentication Required"; /* RFC2616 Section 10.4.8 */
	case 408:
		return "Request Time-out"; /* RFC2616 Section 10.4.9 */
	case 409:
		return "Conflict"; /* RFC2616 Section 10.4.10 */
	case 410:
		return "Gone"; /* RFC2616 Section 10.4.11 */
	case 411:
		return "Length Required"; /* RFC2616 Section 10.4.12 */
	case 412:
		return "Precondition Failed"; /* RFC2616 Section 10.4.13 */
	case 413:
		return "Request Entity Too Large"; /* RFC2616 Section 10.4.14 */
	case 414:
		return "Request-URI Too Large"; /* RFC2616 Section 10.4.15 */
	case 415:
		return "Unsupported Media Type"; /* RFC2616 Section 10.4.16 */
	case 416:
		return "Requested range not satisfiable"; /* RFC2616 Section 10.4.17
		                                           */
	case 417:
		return "Expectation Failed"; /* RFC2616 Section 10.4.18 */

	case 421:
		return "Misdirected Request"; /* RFC7540 Section 9.1.2 */
	case 422:
		return "Unproccessable entity"; /* RFC2518 Section 10.3, RFC4918
		                                 * Section 11.2 */
	case 423:
		return "Locked"; /* RFC2518 Section 10.4, RFC4918 Section 11.3 */
	case 424:
		return "Failed Dependency"; /* RFC2518 Section 10.5, RFC4918
		                             * Section 11.4 */

	case 426:
		return "Upgrade Required"; /* RFC 2817 Section 4 */

	case 428:
		return "Precondition Required"; /* RFC 6585, Section 3 */
	case 429:
		return "Too Many Requests"; /* RFC 6585, Section 4 */

	case 431:
		return "Request Header Fields Too Large"; /* RFC 6585, Section 5 */

	case 451:
		return "Unavailable For Legal Reasons"; /* draft-tbray-http-legally-restricted-status-05,
		                                         * Section 3 */

		/* RFC2616 Section 10.5 - Server Error 5xx */
	case 500:
		return "Internal Server Error"; /* RFC2616 Section 10.5.1 */
	case 501:
		return "Not Implemented"; /* RFC2616 Section 10.5.2 */
	case 502:
		return "Bad Gateway"; /* RFC2616 Section 10.5.3 */
	case 503:
		return "Service Unavailable"; /* RFC2616 Section 10.5.4 */
	case 504:
		return "Gateway Time-out"; /* RFC2616 Section 10.5.5 */
	case 505:
		return "HTTP Version not supported"; /* RFC2616 Section 10.5.6 */
	case 506:
		return "Variant Also Negotiates"; /* RFC 2295, Section 8.1 */
	case 507:
		return "Insufficient Storage"; /* RFC2518 Section 10.6, RFC4918
		                                * Section 11.5 */
	case 508:
		return "Loop Detected"; /* RFC5842 Section 7.1 */

	case 510:
		return "Not Extended"; /* RFC 2774, Section 7 */
	case 511:
		return "Network Authentication Required"; /* RFC 6585, Section 6 */

		/* Other status codes, not shown in the IANA HTTP status code
		 * assignment.
		 * E.g., "de facto" standards due to common use, ... */
	case 418:
		return "I am a teapot"; /* RFC2324 Section 2.3.2 */
	case 419:
		return "Authentication Timeout"; /* common use */
	case 420:
		return "Enhance Your Calm"; /* common use */
	case 440:
		return "Login Timeout"; /* common use */
	case 509:
		return "Bandwidth Limit Exceeded"; /* common use */

	default:
		/* This error code is unknown. This should not happen. */
		if (conn) {
			mg_cry_internal(conn,
			                "Unknown HTTP response code: %u",
			                response_code);
		}

		/* Return at least a category according to RFC 2616 Section 10. */
		if (response_code >= 100 && response_code < 200) {
			/* Unknown informational status code */
			return "Information";
		}
		if (response_code >= 200 && response_code < 300) {
			/* Unknown success code */
			return "Success";
		}
		if (response_code >= 300 && response_code < 400) {
			/* Unknown redirection code */
			return "Redirection";
		}
		if (response_code >= 400 && response_code < 500) {
			/* Unknown request error code */
			return "Client Error";
		}
		if (response_code >= 500 && response_code < 600) {
			/* Unknown server error code */
			return "Server Error";
		}

		/* Response code not even within reasonable range */
		return "";
	}
}